

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::handleSignal(int sig)

{
  long lVar1;
  undefined **ppuVar2;
  long *plVar3;
  size_t sVar4;
  char *__s;
  
  lVar1 = 8;
  __s = "<unknown signal>";
  do {
    if (*(int *)((long)&PTR_registerTranslator_001c7078 + lVar1) == sig) {
      __s = *(char **)((long)&signalDefs + lVar1);
      break;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x68);
  restorePreviousSignalHandlers();
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar2 = &PTR__Context_001c6ff0;
    *IMutableContext::currentContext = &PTR__Context_001c6ff0;
    IMutableContext::currentContext[1] = &PTR__Context_001c7040;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar2 = (undefined **)*IMutableContext::currentContext;
  }
  plVar3 = (long *)(*(code *)ppuVar2[2])();
  sVar4 = strlen(__s);
  (**(code **)(*plVar3 + 0x48))(plVar3,__s,sVar4);
  raise(sig);
  return;
}

Assistant:

static void handleSignal( int sig ) {
        char const * name = "<unknown signal>";
        for (auto const& def : signalDefs) {
            if (sig == def.id) {
                name = def.name;
                break;
            }
        }
        // We need to restore previous signal handlers and let them do
        // their thing, so that the users can have the debugger break
        // when a signal is raised, and so on.
        restorePreviousSignalHandlers();
        reportFatal( name );
        raise( sig );
    }